

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportLibraryDependenciesCommand.h
# Opt level: O2

cmCommand * __thiscall
cmExportLibraryDependenciesCommand::Clone(cmExportLibraryDependenciesCommand *this)

{
  cmExportLibraryDependenciesCommand *this_00;
  
  this_00 = (cmExportLibraryDependenciesCommand *)operator_new(0x58);
  cmExportLibraryDependenciesCommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() override
  {
    return new cmExportLibraryDependenciesCommand;
  }